

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexthtmlparser.cpp
# Opt level: O0

void __thiscall QTextHtmlParser::applyAttributes(QTextHtmlParser *this,QStringList *attributes)

{
  QTextHtmlParserNode *pQVar1;
  QColor color;
  Alignment aalignment;
  Alignment aalignment_00;
  Alignment aalignment_01;
  Alignment aalignment_02;
  initializer_list<QString> args;
  initializer_list<QString> args_00;
  QAnyStringView name;
  QAnyStringView name_00;
  QAnyStringView name_01;
  QAnyStringView name_02;
  QAnyStringView name_03;
  qsizetype *pqVar2;
  bool bVar3;
  bool bVar4;
  Int IVar5;
  qsizetype qVar6;
  QTextHtmlParserNode **ppQVar7;
  QStringView *pQVar8;
  char *pcVar9;
  int *piVar10;
  QList<QString> *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar11;
  bool alignmentSet;
  TokenizerResult<const_QString_&,_char16_t> *__range6;
  int n;
  int i;
  QTextHtmlParserNode *node;
  bool seenQt3Richtext;
  QStringView family;
  sentinel __end6;
  iterator __begin6;
  QStringList families;
  QString value;
  QString key;
  QString linkType;
  QString linkHref;
  QColor c_4;
  QColor c_3;
  QColor c_2;
  QColor c_1;
  QColor c;
  undefined4 in_stack_fffffffffffff5a8;
  CaseSensitivity in_stack_fffffffffffff5ac;
  enum_type in_stack_fffffffffffff5b0;
  LayoutDirection in_stack_fffffffffffff5b4;
  LayoutDirection LVar12;
  undefined4 in_stack_fffffffffffff5b8;
  undefined2 in_stack_fffffffffffff5bc;
  QChar in_stack_fffffffffffff5be;
  QTextHtmlParserNode *in_stack_fffffffffffff5c0;
  QString *in_stack_fffffffffffff5c8;
  QString *in_stack_fffffffffffff5d0;
  QTextHtmlParser *in_stack_fffffffffffff5d8;
  QTextBlockFormat *in_stack_fffffffffffff5f8;
  undefined5 in_stack_fffffffffffff600;
  byte in_stack_fffffffffffff605;
  char in_stack_fffffffffffff606;
  undefined1 in_stack_fffffffffffff607;
  QTextHtmlParserNode *in_stack_fffffffffffff608;
  undefined7 in_stack_fffffffffffff610;
  byte in_stack_fffffffffffff617;
  bool local_9d1;
  undefined1 *local_9b8;
  bool local_992;
  bool local_951;
  int local_920;
  int local_91c;
  char local_909;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_7e8;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_7e4;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_7e0;
  QLatin1StringView local_7d8;
  QLatin1StringView local_7c0;
  QLatin1StringView local_7b0;
  QLatin1StringView local_7a0;
  QLatin1StringView local_778;
  QLatin1StringView local_768;
  undefined1 local_758 [24];
  QLatin1StringView local_740;
  QLatin1StringView local_730;
  QLatin1StringView local_720;
  QLatin1StringView local_710;
  QLatin1StringView local_700;
  QLatin1StringView local_6f0;
  QLatin1StringView local_6e0;
  QLatin1StringView local_6d0;
  QLatin1StringView local_6c0;
  QLatin1StringView local_6b0;
  QLatin1StringView local_6a0;
  QLatin1StringView local_690;
  QLatin1StringView local_680;
  char local_658 [32];
  QColor local_638 [2];
  QLatin1StringView local_618;
  char local_5e8 [32];
  QColor local_5c8 [2];
  QLatin1StringView local_5a8;
  QLatin1StringView local_598;
  undefined4 local_588;
  undefined4 local_584;
  QLatin1StringView local_580;
  int local_56c;
  QLatin1StringView local_568;
  QLatin1StringView local_558;
  char local_528 [32];
  QColor local_508 [2];
  QLatin1StringView local_4e8;
  QLatin1StringView local_4d8;
  QLatin1StringView local_4c8;
  char local_498 [32];
  QColor local_478 [2];
  QLatin1StringView local_458;
  QLatin1StringView local_448;
  QLatin1StringView local_438;
  QLatin1StringView local_428;
  QLatin1StringView local_418;
  QLatin1StringView local_408;
  QLatin1StringView local_3f8;
  QLatin1StringView local_3d0;
  QLatin1StringView local_3c0;
  QLatin1StringView local_3b0;
  QLatin1StringView local_3a0;
  QLatin1StringView local_390;
  QLatin1StringView local_380;
  QLatin1StringView local_370;
  QLatin1StringView local_360;
  QLatin1StringView local_350;
  QLatin1StringView local_340;
  QLatin1StringView local_318;
  QLatin1StringView local_308;
  QLatin1StringView local_2f8;
  QLatin1StringView local_2e8;
  QLatin1StringView local_2d8;
  QLatin1StringView local_2c8;
  char local_298 [32];
  QColor local_278 [2];
  QLatin1StringView local_258;
  QStringView local_230;
  undefined1 *local_208;
  storage_type_conflict *local_200;
  undefined1 local_1f1;
  undefined1 local_1f0 [62];
  undefined2 local_1b2;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  QChar local_192;
  QLatin1StringView local_190;
  QChar local_180;
  char16_t local_17e;
  QChar local_17c;
  char16_t local_17a;
  QLatin1StringView local_178;
  QString local_168;
  undefined1 *local_148;
  undefined1 *puStack_140;
  undefined1 *local_138;
  QString local_128;
  QString local_110;
  QColor local_f8;
  undefined1 *local_e8;
  undefined1 *puStack_e0;
  undefined1 *local_d8;
  undefined1 *puStack_d0;
  undefined1 *local_c8;
  undefined1 *puStack_c0;
  undefined1 *local_b8;
  undefined1 *puStack_b0;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  QStringTokenizerBase<QStringView,_QChar> local_98;
  QString local_78;
  undefined1 local_60 [32];
  undefined1 local_40 [24];
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_909 = '\0';
  local_110.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_110.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_110.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x85e4ee);
  local_128.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_128.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_128.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x85e528);
  qVar6 = QList<QString>::size(in_RSI);
  if (qVar6 % 2 != 1) {
    ppQVar7 = QList<QTextHtmlParserNode_*>::last
                        ((QList<QTextHtmlParserNode_*> *)
                         CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8));
    pQVar1 = *ppQVar7;
    for (local_91c = 0; qVar6 = QList<QString>::size(in_RSI), local_91c < qVar6;
        local_91c = local_91c + 2) {
      local_148 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_140 = &DAT_aaaaaaaaaaaaaaaa;
      local_138 = &DAT_aaaaaaaaaaaaaaaa;
      QList<QString>::at((QList<QString> *)
                         CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
                         CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8));
      QString::QString((QString *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
                       (QString *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8));
      local_168.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_168.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_168.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QList<QString>::at((QList<QString> *)
                         CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
                         CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8));
      QString::QString((QString *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
                       (QString *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8));
      switch(pQVar1->id) {
      case Html_body:
      case Html_tr:
        local_458 = Qt::Literals::StringLiterals::operator____L1
                              ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                CONCAT24(in_stack_fffffffffffff5bc,
                                                         in_stack_fffffffffffff5b8)),
                               CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
        bVar4 = ::operator==((QString *)
                             CONCAT26(in_stack_fffffffffffff5be.ucs,
                                      CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8))
                             ,(QLatin1StringView *)
                              CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
        if (bVar4) {
          local_b8 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
          QAnyStringView::QAnyStringView
                    ((QAnyStringView *)in_stack_fffffffffffff5c0,
                     (QString *)
                     CONCAT26(in_stack_fffffffffffff5be.ucs,
                              CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8)));
          name_00.m_size._0_7_ = in_stack_fffffffffffff610;
          name_00.field_0.m_data = in_stack_fffffffffffff608;
          name_00.m_size._7_1_ = in_stack_fffffffffffff617;
          local_478[0] = QColor::fromString(name_00);
          local_b8 = (undefined1 *)local_478[0]._0_8_;
          puStack_b0._0_6_ = local_478[0].ct._4_6_;
          bVar4 = QColor::isValid((QColor *)&local_b8);
          if (!bVar4) {
            QMessageLogger::QMessageLogger
                      ((QMessageLogger *)in_stack_fffffffffffff5c0,
                       (char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                        CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8
                                                )),in_stack_fffffffffffff5b4,
                       (char *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8));
            QString::toLatin1((QString *)
                              CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8));
            pcVar9 = QByteArray::constData((QByteArray *)0x85f5ae);
            QMessageLogger::warning
                      (local_498,"QTextHtmlParser::applyAttributes: Unknown color name \'%s\'",
                       pcVar9);
            QByteArray::~QByteArray((QByteArray *)0x85f5d4);
          }
          QBrush::QBrush((QBrush *)in_stack_fffffffffffff5c0,
                         (QColor *)
                         CONCAT26(in_stack_fffffffffffff5be.ucs,
                                  CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8)),
                         in_stack_fffffffffffff5b4);
          QTextFormat::setBackground
                    ((QTextFormat *)
                     CONCAT26(in_stack_fffffffffffff5be.ucs,
                              CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8)),
                     (QBrush *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
          QBrush::~QBrush((QBrush *)0x85f61e);
        }
        else {
          local_4c8 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                  CONCAT24(in_stack_fffffffffffff5bc,
                                                           in_stack_fffffffffffff5b8)),
                                 CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
          bVar4 = ::operator==((QString *)
                               CONCAT26(in_stack_fffffffffffff5be.ucs,
                                        CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8
                                                )),
                               (QLatin1StringView *)
                               CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
          if (bVar4) {
            QTextHtmlParserNode::applyBackgroundImage
                      (in_stack_fffffffffffff608,
                       (QString *)
                       CONCAT17(in_stack_fffffffffffff607,
                                CONCAT16(in_stack_fffffffffffff606,
                                         CONCAT15(in_stack_fffffffffffff605,
                                                  in_stack_fffffffffffff600))),
                       (QTextDocument *)in_stack_fffffffffffff5f8);
          }
        }
        break;
      case Html_a:
        local_3c0 = Qt::Literals::StringLiterals::operator____L1
                              ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                CONCAT24(in_stack_fffffffffffff5bc,
                                                         in_stack_fffffffffffff5b8)),
                               CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
        bVar4 = ::operator==((QString *)
                             CONCAT26(in_stack_fffffffffffff5be.ucs,
                                      CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8))
                             ,(QLatin1StringView *)
                              CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
        if (bVar4) {
          QTextCharFormat::setAnchorHref
                    ((QTextCharFormat *)
                     CONCAT26(in_stack_fffffffffffff5be.ucs,
                              CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8)),
                     (QString *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
        }
        else {
          local_3d0 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                  CONCAT24(in_stack_fffffffffffff5bc,
                                                           in_stack_fffffffffffff5b8)),
                                 CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
          bVar4 = ::operator==((QString *)
                               CONCAT26(in_stack_fffffffffffff5be.ucs,
                                        CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8
                                                )),
                               (QLatin1StringView *)
                               CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
          if (bVar4) {
            QString::QString((QString *)
                             CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
                             (QString *)
                             CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8));
            args._M_len = (size_type)in_stack_fffffffffffff5c8;
            args._M_array = &in_stack_fffffffffffff5c0->tag;
            QList<QString>::QList
                      ((QList<QString> *)
                       CONCAT26(in_stack_fffffffffffff5be.ucs,
                                CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8)),args)
            ;
            QTextCharFormat::setAnchorNames
                      ((QTextCharFormat *)
                       CONCAT26(in_stack_fffffffffffff5be.ucs,
                                CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8)),
                       (QStringList *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0))
            ;
            QList<QString>::~QList((QList<QString> *)0x85f1fd);
            local_9b8 = local_40 + 0x18;
            do {
              local_9b8 = local_9b8 + -0x18;
              QString::~QString((QString *)0x85f232);
            } while (local_9b8 != local_40);
          }
        }
        break;
      default:
        break;
      case Html_font:
        local_178 = Qt::Literals::StringLiterals::operator____L1
                              ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                CONCAT24(in_stack_fffffffffffff5bc,
                                                         in_stack_fffffffffffff5b8)),
                               CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
        bVar3 = ::operator==((QString *)
                             CONCAT26(in_stack_fffffffffffff5be.ucs,
                                      CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8))
                             ,(QLatin1StringView *)
                              CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
        bVar4 = false;
        if (bVar3) {
          qVar6 = QString::size(&local_168);
          bVar4 = qVar6 != 0;
        }
        if (bVar4) {
          local_920 = QString::toInt((QString *)
                                     CONCAT26(in_stack_fffffffffffff5be.ucs,
                                              CONCAT24(in_stack_fffffffffffff5bc,
                                                       in_stack_fffffffffffff5b8)),
                                     (bool *)CONCAT44(in_stack_fffffffffffff5b4,
                                                      in_stack_fffffffffffff5b0),
                                     in_stack_fffffffffffff5ac);
          local_17a = (char16_t)
                      QString::at((QString *)
                                  CONCAT26(in_stack_fffffffffffff5be.ucs,
                                           CONCAT24(in_stack_fffffffffffff5bc,
                                                    in_stack_fffffffffffff5b8)),
                                  CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
          QChar::QChar<char16_t,_true>(&local_17c,L'+');
          bVar4 = ::operator!=((QChar *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0
                                                ),
                               (QChar *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8
                                                ));
          local_992 = false;
          if (bVar4) {
            local_17e = (char16_t)
                        QString::at((QString *)
                                    CONCAT26(in_stack_fffffffffffff5be.ucs,
                                             CONCAT24(in_stack_fffffffffffff5bc,
                                                      in_stack_fffffffffffff5b8)),
                                    CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
            QChar::QChar<char16_t,_true>(&local_180,L'-');
            local_992 = ::operator!=((QChar *)CONCAT44(in_stack_fffffffffffff5b4,
                                                       in_stack_fffffffffffff5b0),
                                     (QChar *)CONCAT44(in_stack_fffffffffffff5ac,
                                                       in_stack_fffffffffffff5a8));
          }
          if (local_992 != false) {
            local_920 = local_920 + -3;
          }
          ::QVariant::QVariant((QVariant *)(local_40 + 0x18),local_920);
          QTextFormat::setProperty
                    ((QTextFormat *)in_stack_fffffffffffff5c0,
                     CONCAT22(in_stack_fffffffffffff5be.ucs,in_stack_fffffffffffff5bc),
                     (QVariant *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
          ::QVariant::~QVariant((QVariant *)(local_40 + 0x18));
        }
        else {
          local_190 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                  CONCAT24(in_stack_fffffffffffff5bc,
                                                           in_stack_fffffffffffff5b8)),
                                 CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
          bVar4 = ::operator==((QString *)
                               CONCAT26(in_stack_fffffffffffff5be.ucs,
                                        CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8
                                                )),
                               (QLatin1StringView *)
                               CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
          if (bVar4) {
            QChar::QChar<char16_t,_true>(&local_192,L',');
            bVar4 = QString::contains((QString *)
                                      CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
                                      in_stack_fffffffffffff5be,in_stack_fffffffffffff5ac);
            if (bVar4) {
              local_1b0 = &DAT_aaaaaaaaaaaaaaaa;
              local_1a8 = &DAT_aaaaaaaaaaaaaaaa;
              local_1a0 = &DAT_aaaaaaaaaaaaaaaa;
              QList<QString>::QList((QList<QString> *)0x85e8c1);
              local_1b2 = 0x2c;
              QString::tokenize<char16_t>
                        ((QString *)
                         CONCAT26(in_stack_fffffffffffff5be.ucs,
                                  CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8)),
                         (char16_t *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
              memset(local_1f0,0xaa,0x38);
              QStringTokenizerBase<QStringView,_QChar>::begin
                        ((QStringTokenizerBase<QStringView,_QChar> *)
                         CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
              local_1f1 = 0xaa;
              QStringTokenizerBase<QStringView,_QChar>::end(&local_98);
              while (bVar4 = ::operator!=(local_1f0), bVar4) {
                local_208 = &DAT_aaaaaaaaaaaaaaaa;
                local_200 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
                pQVar8 = QStringTokenizerBase<QStringView,_QChar>::iterator::operator*
                                   ((iterator *)0x85e991);
                local_208 = (undefined1 *)pQVar8->m_size;
                local_200 = pQVar8->m_data;
                local_230 = QStringView::trimmed
                                      ((QStringView *)
                                       CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                CONCAT24(in_stack_fffffffffffff5bc,
                                                         in_stack_fffffffffffff5b8)));
                QStringView::toString
                          ((QStringView *)
                           CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
                QList<QString>::operator<<
                          ((QList<QString> *)
                           CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
                           (rvalue_ref)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8)
                          );
                QString::~QString((QString *)0x85e9fc);
                QStringTokenizerBase<QStringView,_QChar>::iterator::operator++
                          ((iterator *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0)
                          );
              }
              QTextCharFormat::setFontFamilies
                        ((QTextCharFormat *)
                         CONCAT26(in_stack_fffffffffffff5be.ucs,
                                  CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8)),
                         (QStringList *)
                         CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
              QList<QString>::~QList((QList<QString> *)0x85ea34);
            }
            else {
              QList<QString>::QList<QString,void>
                        ((QList<QString> *)
                         CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
                         (QString *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8));
              QTextCharFormat::setFontFamilies
                        ((QTextCharFormat *)
                         CONCAT26(in_stack_fffffffffffff5be.ucs,
                                  CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8)),
                         (QStringList *)
                         CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
              QList<QString>::~QList((QList<QString> *)0x85ea81);
            }
          }
          else {
            local_258 = Qt::Literals::StringLiterals::operator____L1
                                  ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                    CONCAT24(in_stack_fffffffffffff5bc,
                                                             in_stack_fffffffffffff5b8)),
                                   CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
            bVar4 = ::operator==((QString *)
                                 CONCAT26(in_stack_fffffffffffff5be.ucs,
                                          CONCAT24(in_stack_fffffffffffff5bc,
                                                   in_stack_fffffffffffff5b8)),
                                 (QLatin1StringView *)
                                 CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
            if (bVar4) {
              local_a8 = &DAT_aaaaaaaaaaaaaaaa;
              puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
              QAnyStringView::QAnyStringView
                        ((QAnyStringView *)in_stack_fffffffffffff5c0,
                         (QString *)
                         CONCAT26(in_stack_fffffffffffff5be.ucs,
                                  CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8)));
              name.m_size._0_7_ = in_stack_fffffffffffff610;
              name.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)in_stack_fffffffffffff608
              ;
              name.m_size._7_1_ = in_stack_fffffffffffff617;
              local_278[0] = QColor::fromString(name);
              local_a8 = (undefined1 *)local_278[0]._0_8_;
              puStack_a0._0_6_ = local_278[0].ct._4_6_;
              bVar4 = QColor::isValid((QColor *)&local_a8);
              if (!bVar4) {
                QMessageLogger::QMessageLogger
                          ((QMessageLogger *)in_stack_fffffffffffff5c0,
                           (char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                            CONCAT24(in_stack_fffffffffffff5bc,
                                                     in_stack_fffffffffffff5b8)),
                           in_stack_fffffffffffff5b4,
                           (char *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8));
                QString::toLatin1((QString *)
                                  CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8));
                pcVar9 = QByteArray::constData((QByteArray *)0x85eb85);
                QMessageLogger::warning
                          (local_298,"QTextHtmlParser::applyAttributes: Unknown color name \'%s\'",
                           pcVar9);
                QByteArray::~QByteArray((QByteArray *)0x85ebab);
              }
              QBrush::QBrush((QBrush *)in_stack_fffffffffffff5c0,
                             (QColor *)
                             CONCAT26(in_stack_fffffffffffff5be.ucs,
                                      CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8))
                             ,in_stack_fffffffffffff5b4);
              QTextFormat::setForeground
                        ((QTextFormat *)
                         CONCAT26(in_stack_fffffffffffff5be.ucs,
                                  CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8)),
                         (QBrush *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
              QBrush::~QBrush((QBrush *)0x85ebfb);
            }
          }
        }
        break;
      case Html_ul:
      case Html_ol:
        local_2c8 = Qt::Literals::StringLiterals::operator____L1
                              ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                CONCAT24(in_stack_fffffffffffff5bc,
                                                         in_stack_fffffffffffff5b8)),
                               CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
        bVar4 = ::operator==((QString *)
                             CONCAT26(in_stack_fffffffffffff5be.ucs,
                                      CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8))
                             ,(QLatin1StringView *)
                              CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
        if (bVar4) {
          *(ushort *)&pQVar1->field_0x90 = *(ushort *)&pQVar1->field_0x90 & 0xfffb | 4;
          local_2d8 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                  CONCAT24(in_stack_fffffffffffff5bc,
                                                           in_stack_fffffffffffff5b8)),
                                 CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
          bVar4 = ::operator==((QString *)
                               CONCAT26(in_stack_fffffffffffff5be.ucs,
                                        CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8
                                                )),
                               (QLatin1StringView *)
                               CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
          if (bVar4) {
            pQVar1->listStyle = ListDecimal;
          }
          else {
            local_2e8 = Qt::Literals::StringLiterals::operator____L1
                                  ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                    CONCAT24(in_stack_fffffffffffff5bc,
                                                             in_stack_fffffffffffff5b8)),
                                   CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
            bVar4 = ::operator==((QString *)
                                 CONCAT26(in_stack_fffffffffffff5be.ucs,
                                          CONCAT24(in_stack_fffffffffffff5bc,
                                                   in_stack_fffffffffffff5b8)),
                                 (QLatin1StringView *)
                                 CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
            if (bVar4) {
              pQVar1->listStyle = ListLowerAlpha;
            }
            else {
              local_2f8 = Qt::Literals::StringLiterals::operator____L1
                                    ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                      CONCAT24(in_stack_fffffffffffff5bc,
                                                               in_stack_fffffffffffff5b8)),
                                     CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
              bVar4 = ::operator==((QString *)
                                   CONCAT26(in_stack_fffffffffffff5be.ucs,
                                            CONCAT24(in_stack_fffffffffffff5bc,
                                                     in_stack_fffffffffffff5b8)),
                                   (QLatin1StringView *)
                                   CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
              if (bVar4) {
                pQVar1->listStyle = ListUpperAlpha;
              }
              else {
                local_308 = Qt::Literals::StringLiterals::operator____L1
                                      ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                        CONCAT24(in_stack_fffffffffffff5bc,
                                                                 in_stack_fffffffffffff5b8)),
                                       CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0)
                                      );
                bVar4 = ::operator==((QString *)
                                     CONCAT26(in_stack_fffffffffffff5be.ucs,
                                              CONCAT24(in_stack_fffffffffffff5bc,
                                                       in_stack_fffffffffffff5b8)),
                                     (QLatin1StringView *)
                                     CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
                if (bVar4) {
                  pQVar1->listStyle = ListLowerRoman;
                }
                else {
                  local_318 = Qt::Literals::StringLiterals::operator____L1
                                        ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                          CONCAT24(in_stack_fffffffffffff5bc,
                                                                   in_stack_fffffffffffff5b8)),
                                         CONCAT44(in_stack_fffffffffffff5b4,
                                                  in_stack_fffffffffffff5b0));
                  bVar4 = ::operator==((QString *)
                                       CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                CONCAT24(in_stack_fffffffffffff5bc,
                                                         in_stack_fffffffffffff5b8)),
                                       (QLatin1StringView *)
                                       CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0)
                                      );
                  if (bVar4) {
                    pQVar1->listStyle = ListUpperRoman;
                  }
                  else {
                    QString::toLower((QString *)
                                     CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8));
                    QString::operator=((QString *)
                                       CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0)
                                       ,(QString *)
                                        CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8
                                                ));
                    QString::~QString((QString *)0x85ee37);
                    local_340 = Qt::Literals::StringLiterals::operator____L1
                                          ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                            CONCAT24(in_stack_fffffffffffff5bc,
                                                                     in_stack_fffffffffffff5b8)),
                                           CONCAT44(in_stack_fffffffffffff5b4,
                                                    in_stack_fffffffffffff5b0));
                    bVar4 = ::operator==((QString *)
                                         CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                  CONCAT24(in_stack_fffffffffffff5bc,
                                                           in_stack_fffffffffffff5b8)),
                                         (QLatin1StringView *)
                                         CONCAT44(in_stack_fffffffffffff5b4,
                                                  in_stack_fffffffffffff5b0));
                    if (bVar4) {
                      pQVar1->listStyle = ListSquare;
                    }
                    else {
                      local_350 = Qt::Literals::StringLiterals::operator____L1
                                            ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                              CONCAT24(in_stack_fffffffffffff5bc,
                                                                       in_stack_fffffffffffff5b8)),
                                             CONCAT44(in_stack_fffffffffffff5b4,
                                                      in_stack_fffffffffffff5b0));
                      bVar4 = ::operator==((QString *)
                                           CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                    CONCAT24(in_stack_fffffffffffff5bc,
                                                             in_stack_fffffffffffff5b8)),
                                           (QLatin1StringView *)
                                           CONCAT44(in_stack_fffffffffffff5b4,
                                                    in_stack_fffffffffffff5b0));
                      if (bVar4) {
                        pQVar1->listStyle = ListDisc;
                      }
                      else {
                        local_360 = Qt::Literals::StringLiterals::operator____L1
                                              ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                                CONCAT24(in_stack_fffffffffffff5bc,
                                                                         in_stack_fffffffffffff5b8))
                                               ,CONCAT44(in_stack_fffffffffffff5b4,
                                                         in_stack_fffffffffffff5b0));
                        bVar4 = ::operator==((QString *)
                                             CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                      CONCAT24(in_stack_fffffffffffff5bc,
                                                               in_stack_fffffffffffff5b8)),
                                             (QLatin1StringView *)
                                             CONCAT44(in_stack_fffffffffffff5b4,
                                                      in_stack_fffffffffffff5b0));
                        if (bVar4) {
                          pQVar1->listStyle = ListCircle;
                        }
                        else {
                          local_370 = Qt::Literals::StringLiterals::operator____L1
                                                ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                                  CONCAT24(in_stack_fffffffffffff5bc
                                                                           ,
                                                  in_stack_fffffffffffff5b8)),
                                                 CONCAT44(in_stack_fffffffffffff5b4,
                                                          in_stack_fffffffffffff5b0));
                          bVar4 = ::operator==((QString *)
                                               CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                        CONCAT24(in_stack_fffffffffffff5bc,
                                                                 in_stack_fffffffffffff5b8)),
                                               (QLatin1StringView *)
                                               CONCAT44(in_stack_fffffffffffff5b4,
                                                        in_stack_fffffffffffff5b0));
                          if (bVar4) {
                            pQVar1->listStyle = ListStyleUndefined;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        else {
          local_380 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                  CONCAT24(in_stack_fffffffffffff5bc,
                                                           in_stack_fffffffffffff5b8)),
                                 CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
          bVar4 = ::operator==((QString *)
                               CONCAT26(in_stack_fffffffffffff5be.ucs,
                                        CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8
                                                )),
                               (QLatin1StringView *)
                               CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
          if (bVar4) {
            setIntAttribute((int *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
                            (QString *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8)
                           );
          }
        }
        break;
      case Html_li:
        local_390 = Qt::Literals::StringLiterals::operator____L1
                              ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                CONCAT24(in_stack_fffffffffffff5bc,
                                                         in_stack_fffffffffffff5b8)),
                               CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
        bVar4 = ::operator==((QString *)
                             CONCAT26(in_stack_fffffffffffff5be.ucs,
                                      CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8))
                             ,(QLatin1StringView *)
                              CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
        if (bVar4) {
          local_3a0 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                  CONCAT24(in_stack_fffffffffffff5bc,
                                                           in_stack_fffffffffffff5b8)),
                                 CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
          bVar4 = ::operator==((QString *)
                               CONCAT26(in_stack_fffffffffffff5be.ucs,
                                        CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8
                                                )),
                               (QLatin1StringView *)
                               CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
          if (bVar4) {
            QTextBlockFormat::setMarker
                      ((QTextBlockFormat *)
                       CONCAT26(in_stack_fffffffffffff5be.ucs,
                                CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8)),
                       in_stack_fffffffffffff5b4);
          }
          else {
            local_3b0 = Qt::Literals::StringLiterals::operator____L1
                                  ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                    CONCAT24(in_stack_fffffffffffff5bc,
                                                             in_stack_fffffffffffff5b8)),
                                   CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
            bVar4 = ::operator==((QString *)
                                 CONCAT26(in_stack_fffffffffffff5be.ucs,
                                          CONCAT24(in_stack_fffffffffffff5bc,
                                                   in_stack_fffffffffffff5b8)),
                                 (QLatin1StringView *)
                                 CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
            if (bVar4) {
              QTextBlockFormat::setMarker
                        ((QTextBlockFormat *)
                         CONCAT26(in_stack_fffffffffffff5be.ucs,
                                  CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8)),
                         in_stack_fffffffffffff5b4);
            }
          }
        }
        break;
      case Html_img:
        local_3f8 = Qt::Literals::StringLiterals::operator____L1
                              ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                CONCAT24(in_stack_fffffffffffff5bc,
                                                         in_stack_fffffffffffff5b8)),
                               CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
        bVar4 = ::operator==((QString *)
                             CONCAT26(in_stack_fffffffffffff5be.ucs,
                                      CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8))
                             ,(QLatin1StringView *)
                              CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
        local_9d1 = true;
        if (!bVar4) {
          local_408 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                  CONCAT24(in_stack_fffffffffffff5bc,
                                                           in_stack_fffffffffffff5b8)),
                                 CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
          local_9d1 = ::operator==((QString *)
                                   CONCAT26(in_stack_fffffffffffff5be.ucs,
                                            CONCAT24(in_stack_fffffffffffff5bc,
                                                     in_stack_fffffffffffff5b8)),
                                   (QLatin1StringView *)
                                   CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
        }
        if (local_9d1 == false) {
          local_418 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                  CONCAT24(in_stack_fffffffffffff5bc,
                                                           in_stack_fffffffffffff5b8)),
                                 CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
          bVar4 = ::operator==((QString *)
                               CONCAT26(in_stack_fffffffffffff5be.ucs,
                                        CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8
                                                )),
                               (QLatin1StringView *)
                               CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
          if (bVar4) {
            pQVar1->imageWidth = -2.0;
            setFloatAttribute((qreal *)in_stack_fffffffffffff5c0,
                              (QString *)
                              CONCAT26(in_stack_fffffffffffff5be.ucs,
                                       CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8)
                                      ));
          }
          else {
            local_428 = Qt::Literals::StringLiterals::operator____L1
                                  ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                    CONCAT24(in_stack_fffffffffffff5bc,
                                                             in_stack_fffffffffffff5b8)),
                                   CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
            bVar4 = ::operator==((QString *)
                                 CONCAT26(in_stack_fffffffffffff5be.ucs,
                                          CONCAT24(in_stack_fffffffffffff5bc,
                                                   in_stack_fffffffffffff5b8)),
                                 (QLatin1StringView *)
                                 CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
            if (bVar4) {
              pQVar1->imageHeight = -2.0;
              setFloatAttribute((qreal *)in_stack_fffffffffffff5c0,
                                (QString *)
                                CONCAT26(in_stack_fffffffffffff5be.ucs,
                                         CONCAT24(in_stack_fffffffffffff5bc,
                                                  in_stack_fffffffffffff5b8)));
            }
            else {
              local_438 = Qt::Literals::StringLiterals::operator____L1
                                    ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                      CONCAT24(in_stack_fffffffffffff5bc,
                                                               in_stack_fffffffffffff5b8)),
                                     CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
              bVar4 = ::operator==((QString *)
                                   CONCAT26(in_stack_fffffffffffff5be.ucs,
                                            CONCAT24(in_stack_fffffffffffff5bc,
                                                     in_stack_fffffffffffff5b8)),
                                   (QLatin1StringView *)
                                   CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
              if (bVar4) {
                QString::operator=(&pQVar1->imageAlt,(QString *)&local_168);
              }
              else {
                local_448 = Qt::Literals::StringLiterals::operator____L1
                                      ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                        CONCAT24(in_stack_fffffffffffff5bc,
                                                                 in_stack_fffffffffffff5b8)),
                                       CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0)
                                      );
                bVar4 = ::operator==((QString *)
                                     CONCAT26(in_stack_fffffffffffff5be.ucs,
                                              CONCAT24(in_stack_fffffffffffff5bc,
                                                       in_stack_fffffffffffff5b8)),
                                     (QLatin1StringView *)
                                     CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
                if (bVar4) {
                  QString::operator=(&pQVar1->text,(QString *)&local_168);
                }
              }
            }
          }
        }
        else {
          QString::operator=(&pQVar1->imageName,(QString *)&local_168);
        }
        break;
      case Html_hr:
        local_710 = Qt::Literals::StringLiterals::operator____L1
                              ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                CONCAT24(in_stack_fffffffffffff5bc,
                                                         in_stack_fffffffffffff5b8)),
                               CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
        bVar4 = ::operator==((QString *)
                             CONCAT26(in_stack_fffffffffffff5be.ucs,
                                      CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8))
                             ,(QLatin1StringView *)
                              CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
        if (bVar4) {
          setWidthAttribute((QTextLength *)
                            CONCAT26(in_stack_fffffffffffff5be.ucs,
                                     CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8)),
                            (QString *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0)
                           );
        }
        break;
      case Html_pre:
        local_740 = Qt::Literals::StringLiterals::operator____L1
                              ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                CONCAT24(in_stack_fffffffffffff5bc,
                                                         in_stack_fffffffffffff5b8)),
                               CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
        bVar4 = ::operator==((QString *)
                             CONCAT26(in_stack_fffffffffffff5be.ucs,
                                      CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8))
                             ,(QLatin1StringView *)
                              CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
        in_stack_fffffffffffff605 = 0;
        if (bVar4) {
          QVar11 = Qt::Literals::StringLiterals::operator____L1
                             ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                               CONCAT24(in_stack_fffffffffffff5bc,
                                                        in_stack_fffffffffffff5b8)),
                              CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
          in_stack_fffffffffffff605 =
               QString::startsWith((QLatin1String *)&local_168,(CaseSensitivity)QVar11.m_size);
        }
        if ((in_stack_fffffffffffff605 & 1) != 0) {
          in_stack_fffffffffffff5f8 = &pQVar1->blockFormat;
          QString::mid((longlong)local_758,(longlong)&local_168);
          ::QVariant::QVariant((QVariant *)local_60,(QString *)local_758);
          QTextFormat::setProperty
                    ((QTextFormat *)in_stack_fffffffffffff5c0,
                     CONCAT22(in_stack_fffffffffffff5be.ucs,in_stack_fffffffffffff5bc),
                     (QVariant *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
          ::QVariant::~QVariant((QVariant *)local_60);
          QString::~QString((QString *)0x8602b9);
        }
        break;
      case Html_table:
        local_598 = Qt::Literals::StringLiterals::operator____L1
                              ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                CONCAT24(in_stack_fffffffffffff5bc,
                                                         in_stack_fffffffffffff5b8)),
                               CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
        bVar4 = ::operator==((QString *)
                             CONCAT26(in_stack_fffffffffffff5be.ucs,
                                      CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8))
                             ,(QLatin1StringView *)
                              CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
        in_stack_fffffffffffff617 = 0;
        if (bVar4) {
          in_stack_fffffffffffff617 = pQVar1->tableBorder != 0.0 ^ 0xff;
        }
        if ((in_stack_fffffffffffff617 & 1) == 0) {
          local_5a8 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                  CONCAT24(in_stack_fffffffffffff5bc,
                                                           in_stack_fffffffffffff5b8)),
                                 CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
          bVar4 = ::operator==((QString *)
                               CONCAT26(in_stack_fffffffffffff5be.ucs,
                                        CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8
                                                )),
                               (QLatin1StringView *)
                               CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
          if (bVar4) {
            local_d8 = &DAT_aaaaaaaaaaaaaaaa;
            puStack_d0 = &DAT_aaaaaaaaaaaaaaaa;
            QAnyStringView::QAnyStringView
                      ((QAnyStringView *)in_stack_fffffffffffff5c0,
                       (QString *)
                       CONCAT26(in_stack_fffffffffffff5be.ucs,
                                CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8)));
            name_02.m_size._0_7_ = in_stack_fffffffffffff610;
            name_02.field_0.m_data = in_stack_fffffffffffff608;
            name_02.m_size._7_1_ = in_stack_fffffffffffff617;
            local_5c8[0] = QColor::fromString(name_02);
            local_d8 = (undefined1 *)local_5c8[0]._0_8_;
            puStack_d0._0_6_ = local_5c8[0].ct._4_6_;
            bVar4 = QColor::isValid((QColor *)&local_d8);
            if (!bVar4) {
              QMessageLogger::QMessageLogger
                        ((QMessageLogger *)in_stack_fffffffffffff5c0,
                         (char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                          CONCAT24(in_stack_fffffffffffff5bc,
                                                   in_stack_fffffffffffff5b8)),
                         in_stack_fffffffffffff5b4,
                         (char *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8));
              QString::toLatin1((QString *)
                                CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8));
              pcVar9 = QByteArray::constData((QByteArray *)0x85fb9c);
              QMessageLogger::warning
                        (local_5e8,"QTextHtmlParser::applyAttributes: Unknown color name \'%s\'",
                         pcVar9);
              QByteArray::~QByteArray((QByteArray *)0x85fbc2);
            }
            in_stack_fffffffffffff608 = (QTextHtmlParserNode *)&pQVar1->charFormat;
            QBrush::QBrush((QBrush *)in_stack_fffffffffffff5c0,
                           (QColor *)
                           CONCAT26(in_stack_fffffffffffff5be.ucs,
                                    CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8)),
                           in_stack_fffffffffffff5b4);
            QTextFormat::setBackground
                      ((QTextFormat *)
                       CONCAT26(in_stack_fffffffffffff5be.ucs,
                                CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8)),
                       (QBrush *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
            QBrush::~QBrush((QBrush *)0x85fc0c);
          }
          else {
            local_618 = Qt::Literals::StringLiterals::operator____L1
                                  ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                    CONCAT24(in_stack_fffffffffffff5bc,
                                                             in_stack_fffffffffffff5b8)),
                                   CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
            bVar4 = ::operator==((QString *)
                                 CONCAT26(in_stack_fffffffffffff5be.ucs,
                                          CONCAT24(in_stack_fffffffffffff5bc,
                                                   in_stack_fffffffffffff5b8)),
                                 (QLatin1StringView *)
                                 CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
            if (bVar4) {
              local_e8 = &DAT_aaaaaaaaaaaaaaaa;
              puStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
              QAnyStringView::QAnyStringView
                        ((QAnyStringView *)in_stack_fffffffffffff5c0,
                         (QString *)
                         CONCAT26(in_stack_fffffffffffff5be.ucs,
                                  CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8)));
              name_03.m_size._0_7_ = in_stack_fffffffffffff610;
              name_03.field_0.m_data = in_stack_fffffffffffff608;
              name_03.m_size._7_1_ = in_stack_fffffffffffff617;
              local_638[0] = QColor::fromString(name_03);
              local_e8 = (undefined1 *)local_638[0]._0_8_;
              puStack_e0._0_6_ = local_638[0].ct._4_6_;
              bVar4 = QColor::isValid((QColor *)&local_e8);
              if (!bVar4) {
                QMessageLogger::QMessageLogger
                          ((QMessageLogger *)in_stack_fffffffffffff5c0,
                           (char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                            CONCAT24(in_stack_fffffffffffff5bc,
                                                     in_stack_fffffffffffff5b8)),
                           in_stack_fffffffffffff5b4,
                           (char *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8));
                QString::toLatin1((QString *)
                                  CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8));
                pcVar9 = QByteArray::constData((QByteArray *)0x85fd10);
                QMessageLogger::warning
                          (local_658,"QTextHtmlParser::applyAttributes: Unknown color name \'%s\'",
                           pcVar9);
                QByteArray::~QByteArray((QByteArray *)0x85fd36);
              }
              local_f8._0_8_ = local_e8;
              local_f8._8_8_ = puStack_e0;
              color.ct._0_4_ = in_stack_fffffffffffff5b4;
              color.cspec = in_stack_fffffffffffff5b0;
              color.ct._4_4_ = in_stack_fffffffffffff5b8;
              color.ct.argb.pad = in_stack_fffffffffffff5bc;
              color._14_2_ = in_stack_fffffffffffff5be.ucs;
              QBrush::operator=((QBrush *)
                                CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8),color)
              ;
            }
            else {
              local_680 = Qt::Literals::StringLiterals::operator____L1
                                    ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                      CONCAT24(in_stack_fffffffffffff5bc,
                                                               in_stack_fffffffffffff5b8)),
                                     CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
              bVar4 = ::operator==((QString *)
                                   CONCAT26(in_stack_fffffffffffff5be.ucs,
                                            CONCAT24(in_stack_fffffffffffff5bc,
                                                     in_stack_fffffffffffff5b8)),
                                   (QLatin1StringView *)
                                   CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
              if (bVar4) {
                QTextHtmlParserNode::applyBackgroundImage
                          (in_stack_fffffffffffff608,
                           (QString *)
                           CONCAT17(in_stack_fffffffffffff607,
                                    CONCAT16(in_stack_fffffffffffff606,
                                             CONCAT15(in_stack_fffffffffffff605,
                                                      in_stack_fffffffffffff600))),
                           (QTextDocument *)in_stack_fffffffffffff5f8);
              }
              else {
                local_690 = Qt::Literals::StringLiterals::operator____L1
                                      ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                        CONCAT24(in_stack_fffffffffffff5bc,
                                                                 in_stack_fffffffffffff5b8)),
                                       CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0)
                                      );
                bVar4 = ::operator==((QString *)
                                     CONCAT26(in_stack_fffffffffffff5be.ucs,
                                              CONCAT24(in_stack_fffffffffffff5bc,
                                                       in_stack_fffffffffffff5b8)),
                                     (QLatin1StringView *)
                                     CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
                if (bVar4) {
                  setFloatAttribute((qreal *)in_stack_fffffffffffff5c0,
                                    (QString *)
                                    CONCAT26(in_stack_fffffffffffff5be.ucs,
                                             CONCAT24(in_stack_fffffffffffff5bc,
                                                      in_stack_fffffffffffff5b8)));
                }
                else {
                  local_6a0 = Qt::Literals::StringLiterals::operator____L1
                                        ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                          CONCAT24(in_stack_fffffffffffff5bc,
                                                                   in_stack_fffffffffffff5b8)),
                                         CONCAT44(in_stack_fffffffffffff5b4,
                                                  in_stack_fffffffffffff5b0));
                  bVar4 = ::operator==((QString *)
                                       CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                CONCAT24(in_stack_fffffffffffff5bc,
                                                         in_stack_fffffffffffff5b8)),
                                       (QLatin1StringView *)
                                       CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0)
                                      );
                  if (bVar4) {
                    setFloatAttribute((qreal *)in_stack_fffffffffffff5c0,
                                      (QString *)
                                      CONCAT26(in_stack_fffffffffffff5be.ucs,
                                               CONCAT24(in_stack_fffffffffffff5bc,
                                                        in_stack_fffffffffffff5b8)));
                  }
                  else {
                    local_6b0 = Qt::Literals::StringLiterals::operator____L1
                                          ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                            CONCAT24(in_stack_fffffffffffff5bc,
                                                                     in_stack_fffffffffffff5b8)),
                                           CONCAT44(in_stack_fffffffffffff5b4,
                                                    in_stack_fffffffffffff5b0));
                    bVar4 = ::operator==((QString *)
                                         CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                  CONCAT24(in_stack_fffffffffffff5bc,
                                                           in_stack_fffffffffffff5b8)),
                                         (QLatin1StringView *)
                                         CONCAT44(in_stack_fffffffffffff5b4,
                                                  in_stack_fffffffffffff5b0));
                    if (bVar4) {
                      setWidthAttribute((QTextLength *)
                                        CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                 CONCAT24(in_stack_fffffffffffff5bc,
                                                          in_stack_fffffffffffff5b8)),
                                        (QString *)
                                        CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0
                                                ));
                    }
                    else {
                      local_6c0 = Qt::Literals::StringLiterals::operator____L1
                                            ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                              CONCAT24(in_stack_fffffffffffff5bc,
                                                                       in_stack_fffffffffffff5b8)),
                                             CONCAT44(in_stack_fffffffffffff5b4,
                                                      in_stack_fffffffffffff5b0));
                      bVar4 = ::operator==((QString *)
                                           CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                    CONCAT24(in_stack_fffffffffffff5bc,
                                                             in_stack_fffffffffffff5b8)),
                                           (QLatin1StringView *)
                                           CONCAT44(in_stack_fffffffffffff5b4,
                                                    in_stack_fffffffffffff5b0));
                      if (bVar4) {
                        setWidthAttribute((QTextLength *)
                                          CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                   CONCAT24(in_stack_fffffffffffff5bc,
                                                            in_stack_fffffffffffff5b8)),
                                          (QString *)
                                          CONCAT44(in_stack_fffffffffffff5b4,
                                                   in_stack_fffffffffffff5b0));
                      }
                    }
                  }
                }
              }
            }
          }
        }
        else {
          setFloatAttribute((qreal *)in_stack_fffffffffffff5c0,
                            (QString *)
                            CONCAT26(in_stack_fffffffffffff5be.ucs,
                                     CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8)))
          ;
        }
        break;
      case Html_td:
      case Html_th:
        local_4d8 = Qt::Literals::StringLiterals::operator____L1
                              ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                CONCAT24(in_stack_fffffffffffff5bc,
                                                         in_stack_fffffffffffff5b8)),
                               CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
        bVar4 = ::operator==((QString *)
                             CONCAT26(in_stack_fffffffffffff5be.ucs,
                                      CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8))
                             ,(QLatin1StringView *)
                              CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
        if (bVar4) {
          setWidthAttribute((QTextLength *)
                            CONCAT26(in_stack_fffffffffffff5be.ucs,
                                     CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8)),
                            (QString *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0)
                           );
        }
        else {
          local_4e8 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                  CONCAT24(in_stack_fffffffffffff5bc,
                                                           in_stack_fffffffffffff5b8)),
                                 CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
          bVar4 = ::operator==((QString *)
                               CONCAT26(in_stack_fffffffffffff5be.ucs,
                                        CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8
                                                )),
                               (QLatin1StringView *)
                               CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
          if (bVar4) {
            local_c8 = &DAT_aaaaaaaaaaaaaaaa;
            puStack_c0 = &DAT_aaaaaaaaaaaaaaaa;
            QAnyStringView::QAnyStringView
                      ((QAnyStringView *)in_stack_fffffffffffff5c0,
                       (QString *)
                       CONCAT26(in_stack_fffffffffffff5be.ucs,
                                CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8)));
            name_01.m_size._0_7_ = in_stack_fffffffffffff610;
            name_01.field_0.m_data = in_stack_fffffffffffff608;
            name_01.m_size._7_1_ = in_stack_fffffffffffff617;
            local_508[0] = QColor::fromString(name_01);
            local_c8 = (undefined1 *)local_508[0]._0_8_;
            puStack_c0._0_6_ = local_508[0].ct._4_6_;
            bVar4 = QColor::isValid((QColor *)&local_c8);
            if (!bVar4) {
              QMessageLogger::QMessageLogger
                        ((QMessageLogger *)in_stack_fffffffffffff5c0,
                         (char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                          CONCAT24(in_stack_fffffffffffff5bc,
                                                   in_stack_fffffffffffff5b8)),
                         in_stack_fffffffffffff5b4,
                         (char *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8));
              QString::toLatin1((QString *)
                                CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8));
              pcVar9 = QByteArray::constData((QByteArray *)0x85f7e0);
              QMessageLogger::warning
                        (local_528,"QTextHtmlParser::applyAttributes: Unknown color name \'%s\'",
                         pcVar9);
              QByteArray::~QByteArray((QByteArray *)0x85f806);
            }
            QBrush::QBrush((QBrush *)in_stack_fffffffffffff5c0,
                           (QColor *)
                           CONCAT26(in_stack_fffffffffffff5be.ucs,
                                    CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8)),
                           in_stack_fffffffffffff5b4);
            QTextFormat::setBackground
                      ((QTextFormat *)
                       CONCAT26(in_stack_fffffffffffff5be.ucs,
                                CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8)),
                       (QBrush *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
            QBrush::~QBrush((QBrush *)0x85f850);
          }
          else {
            local_558 = Qt::Literals::StringLiterals::operator____L1
                                  ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                    CONCAT24(in_stack_fffffffffffff5bc,
                                                             in_stack_fffffffffffff5b8)),
                                   CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
            bVar4 = ::operator==((QString *)
                                 CONCAT26(in_stack_fffffffffffff5be.ucs,
                                          CONCAT24(in_stack_fffffffffffff5bc,
                                                   in_stack_fffffffffffff5b8)),
                                 (QLatin1StringView *)
                                 CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
            if (bVar4) {
              QTextHtmlParserNode::applyBackgroundImage
                        (in_stack_fffffffffffff608,
                         (QString *)
                         CONCAT17(in_stack_fffffffffffff607,
                                  CONCAT16(in_stack_fffffffffffff606,
                                           CONCAT15(in_stack_fffffffffffff605,
                                                    in_stack_fffffffffffff600))),
                         (QTextDocument *)in_stack_fffffffffffff5f8);
            }
            else {
              local_568 = Qt::Literals::StringLiterals::operator____L1
                                    ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                      CONCAT24(in_stack_fffffffffffff5bc,
                                                               in_stack_fffffffffffff5b8)),
                                     CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
              bVar4 = ::operator==((QString *)
                                   CONCAT26(in_stack_fffffffffffff5be.ucs,
                                            CONCAT24(in_stack_fffffffffffff5bc,
                                                     in_stack_fffffffffffff5b8)),
                                   (QLatin1StringView *)
                                   CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
              if (bVar4) {
                bVar4 = setIntAttribute((int *)CONCAT44(in_stack_fffffffffffff5b4,
                                                        in_stack_fffffffffffff5b0),
                                        (QString *)
                                        CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8
                                                ));
                if (bVar4) {
                  local_56c = 1;
                  piVar10 = qMax<int>(&local_56c,&pQVar1->tableCellRowSpan);
                  pQVar1->tableCellRowSpan = *piVar10;
                }
              }
              else {
                local_580 = Qt::Literals::StringLiterals::operator____L1
                                      ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                        CONCAT24(in_stack_fffffffffffff5bc,
                                                                 in_stack_fffffffffffff5b8)),
                                       CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0)
                                      );
                bVar4 = ::operator==((QString *)
                                     CONCAT26(in_stack_fffffffffffff5be.ucs,
                                              CONCAT24(in_stack_fffffffffffff5bc,
                                                       in_stack_fffffffffffff5b8)),
                                     (QLatin1StringView *)
                                     CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
                if ((bVar4) &&
                   (bVar4 = setIntAttribute((int *)CONCAT44(in_stack_fffffffffffff5b4,
                                                            in_stack_fffffffffffff5b0),
                                            (QString *)
                                            CONCAT44(in_stack_fffffffffffff5ac,
                                                     in_stack_fffffffffffff5a8)), bVar4)) {
                  local_584 = 1;
                  local_588 = 0x5000;
                  piVar10 = qBound<int>((int *)in_stack_fffffffffffff5c0,
                                        (int *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                        CONCAT24(in_stack_fffffffffffff5bc,
                                                                 in_stack_fffffffffffff5b8)),
                                        (int *)CONCAT44(in_stack_fffffffffffff5b4,
                                                        in_stack_fffffffffffff5b0));
                  pQVar1->tableCellColSpan = *piVar10;
                }
              }
            }
          }
        }
        break;
      case Html_meta:
        local_6d0 = Qt::Literals::StringLiterals::operator____L1
                              ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                CONCAT24(in_stack_fffffffffffff5bc,
                                                         in_stack_fffffffffffff5b8)),
                               CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
        bVar4 = ::operator==((QString *)
                             CONCAT26(in_stack_fffffffffffff5be.ucs,
                                      CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8))
                             ,(QLatin1StringView *)
                              CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
        in_stack_fffffffffffff607 = false;
        if (bVar4) {
          local_6e0 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                  CONCAT24(in_stack_fffffffffffff5bc,
                                                           in_stack_fffffffffffff5b8)),
                                 CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
          in_stack_fffffffffffff607 =
               ::operator==((QString *)
                            CONCAT26(in_stack_fffffffffffff5be.ucs,
                                     CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8)),
                            (QLatin1StringView *)
                            CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
        }
        if ((bool)in_stack_fffffffffffff607 != false) {
          local_909 = '\x01';
        }
        local_6f0 = Qt::Literals::StringLiterals::operator____L1
                              ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                CONCAT24(in_stack_fffffffffffff5bc,
                                                         in_stack_fffffffffffff5b8)),
                               CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
        bVar4 = ::operator==((QString *)
                             CONCAT26(in_stack_fffffffffffff5be.ucs,
                                      CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8))
                             ,(QLatin1StringView *)
                              CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
        in_stack_fffffffffffff606 = '\0';
        if (bVar4) {
          local_700 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                  CONCAT24(in_stack_fffffffffffff5bc,
                                                           in_stack_fffffffffffff5b8)),
                                 CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
          bVar4 = ::operator==((QString *)
                               CONCAT26(in_stack_fffffffffffff5be.ucs,
                                        CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8
                                                )),
                               (QLatin1StringView *)
                               CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
          in_stack_fffffffffffff606 = local_909;
          if (!bVar4) {
            in_stack_fffffffffffff606 = '\0';
          }
        }
        if (in_stack_fffffffffffff606 != '\0') {
          *(undefined1 *)(in_RDI + 0x38) = 1;
        }
        break;
      case Html_link:
        local_720 = Qt::Literals::StringLiterals::operator____L1
                              ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                CONCAT24(in_stack_fffffffffffff5bc,
                                                         in_stack_fffffffffffff5b8)),
                               CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
        bVar4 = ::operator==((QString *)
                             CONCAT26(in_stack_fffffffffffff5be.ucs,
                                      CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8))
                             ,(QLatin1StringView *)
                              CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
        if (bVar4) {
          QString::operator=(&local_110,(QString *)&local_168);
        }
        else {
          local_730 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                  CONCAT24(in_stack_fffffffffffff5bc,
                                                           in_stack_fffffffffffff5b8)),
                                 CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
          bVar4 = ::operator==((QString *)
                               CONCAT26(in_stack_fffffffffffff5be.ucs,
                                        CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8
                                                )),
                               (QLatin1StringView *)
                               CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
          if (bVar4) {
            QString::operator=(&local_128,(QString *)&local_168);
          }
        }
      }
      local_768 = Qt::Literals::StringLiterals::operator____L1
                            ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                              CONCAT24(in_stack_fffffffffffff5bc,
                                                       in_stack_fffffffffffff5b8)),
                             CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
      bVar4 = ::operator==((QString *)
                           CONCAT26(in_stack_fffffffffffff5be.ucs,
                                    CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8)),
                           (QLatin1StringView *)
                           CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
      if (bVar4) {
        QTextHtmlParserNode::parseStyleAttribute
                  (in_stack_fffffffffffff5c0,
                   (QString *)
                   CONCAT26(in_stack_fffffffffffff5be.ucs,
                            CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8)),
                   (QTextDocument *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
      }
      else {
        local_778 = Qt::Literals::StringLiterals::operator____L1
                              ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                CONCAT24(in_stack_fffffffffffff5bc,
                                                         in_stack_fffffffffffff5b8)),
                               CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
        bVar4 = ::operator==((QString *)
                             CONCAT26(in_stack_fffffffffffff5be.ucs,
                                      CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8))
                             ,(QLatin1StringView *)
                              CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
        if (bVar4) {
          QString::toLower((QString *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8))
          ;
          QString::operator=((QString *)
                             CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
                             (QString *)
                             CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8));
          QString::~QString((QString *)0x860395);
          local_951 = true;
          local_7a0 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                  CONCAT24(in_stack_fffffffffffff5bc,
                                                           in_stack_fffffffffffff5b8)),
                                 CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
          bVar4 = ::operator==((QString *)
                               CONCAT26(in_stack_fffffffffffff5be.ucs,
                                        CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8
                                                )),
                               (QLatin1StringView *)
                               CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
          if (bVar4) {
            Qt::operator|(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0);
            aalignment.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
            super_QFlagsStorage<Qt::AlignmentFlag>.i._2_2_ = in_stack_fffffffffffff5be.ucs;
            aalignment.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
            super_QFlagsStorage<Qt::AlignmentFlag>.i._0_2_ = in_stack_fffffffffffff5bc;
            QTextBlockFormat::setAlignment
                      ((QTextBlockFormat *)
                       CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),aalignment);
          }
          else {
            local_7b0 = Qt::Literals::StringLiterals::operator____L1
                                  ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                    CONCAT24(in_stack_fffffffffffff5bc,
                                                             in_stack_fffffffffffff5b8)),
                                   CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
            bVar4 = ::operator==((QString *)
                                 CONCAT26(in_stack_fffffffffffff5be.ucs,
                                          CONCAT24(in_stack_fffffffffffff5bc,
                                                   in_stack_fffffffffffff5b8)),
                                 (QLatin1StringView *)
                                 CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
            if (bVar4) {
              Qt::operator|(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0);
              aalignment_00.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
              super_QFlagsStorage<Qt::AlignmentFlag>.i._2_2_ = in_stack_fffffffffffff5be.ucs;
              aalignment_00.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
              super_QFlagsStorage<Qt::AlignmentFlag>.i._0_2_ = in_stack_fffffffffffff5bc;
              QTextBlockFormat::setAlignment
                        ((QTextBlockFormat *)
                         CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),aalignment_00
                        );
            }
            else {
              local_7c0 = Qt::Literals::StringLiterals::operator____L1
                                    ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                      CONCAT24(in_stack_fffffffffffff5bc,
                                                               in_stack_fffffffffffff5b8)),
                                     CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
              bVar4 = ::operator==((QString *)
                                   CONCAT26(in_stack_fffffffffffff5be.ucs,
                                            CONCAT24(in_stack_fffffffffffff5bc,
                                                     in_stack_fffffffffffff5b8)),
                                   (QLatin1StringView *)
                                   CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
              if (bVar4) {
                QFlags<Qt::AlignmentFlag>::QFlags
                          ((QFlags<Qt::AlignmentFlag> *)
                           CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
                           in_stack_fffffffffffff5ac);
                aalignment_01.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                super_QFlagsStorage<Qt::AlignmentFlag>.i._2_2_ = in_stack_fffffffffffff5be.ucs;
                aalignment_01.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                super_QFlagsStorage<Qt::AlignmentFlag>.i._0_2_ = in_stack_fffffffffffff5bc;
                QTextBlockFormat::setAlignment
                          ((QTextBlockFormat *)
                           CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
                           aalignment_01);
              }
              else {
                local_7d8 = Qt::Literals::StringLiterals::operator____L1
                                      ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                        CONCAT24(in_stack_fffffffffffff5bc,
                                                                 in_stack_fffffffffffff5b8)),
                                       CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0)
                                      );
                local_951 = ::operator==((QString *)
                                         CONCAT26(in_stack_fffffffffffff5be.ucs,
                                                  CONCAT24(in_stack_fffffffffffff5bc,
                                                           in_stack_fffffffffffff5b8)),
                                         (QLatin1StringView *)
                                         CONCAT44(in_stack_fffffffffffff5b4,
                                                  in_stack_fffffffffffff5b0));
                if (local_951) {
                  in_stack_fffffffffffff5d8 = (QTextHtmlParser *)&pQVar1->blockFormat;
                  QFlags<Qt::AlignmentFlag>::QFlags
                            ((QFlags<Qt::AlignmentFlag> *)
                             CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
                             in_stack_fffffffffffff5ac);
                  aalignment_02.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                  super_QFlagsStorage<Qt::AlignmentFlag>.i._2_2_ = in_stack_fffffffffffff5be.ucs;
                  aalignment_02.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                  super_QFlagsStorage<Qt::AlignmentFlag>.i._0_2_ = in_stack_fffffffffffff5bc;
                  QTextBlockFormat::setAlignment
                            ((QTextBlockFormat *)
                             CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
                             aalignment_02);
                }
              }
            }
          }
          if (pQVar1->id == Html_img) {
            if (local_951 == false) {
              Qt::Literals::StringLiterals::operator____L1
                        ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                          CONCAT24(in_stack_fffffffffffff5bc,
                                                   in_stack_fffffffffffff5b8)),
                         CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
              bVar4 = ::operator==((QString *)
                                   CONCAT26(in_stack_fffffffffffff5be.ucs,
                                            CONCAT24(in_stack_fffffffffffff5bc,
                                                     in_stack_fffffffffffff5b8)),
                                   (QLatin1StringView *)
                                   CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
              if (bVar4) {
                QTextCharFormat::setVerticalAlignment
                          ((QTextCharFormat *)
                           CONCAT26(in_stack_fffffffffffff5be.ucs,
                                    CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8)),
                           in_stack_fffffffffffff5b4);
              }
              else {
                Qt::Literals::StringLiterals::operator____L1
                          ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                            CONCAT24(in_stack_fffffffffffff5bc,
                                                     in_stack_fffffffffffff5b8)),
                           CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
                bVar4 = ::operator==((QString *)
                                     CONCAT26(in_stack_fffffffffffff5be.ucs,
                                              CONCAT24(in_stack_fffffffffffff5bc,
                                                       in_stack_fffffffffffff5b8)),
                                     (QLatin1StringView *)
                                     CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
                if (bVar4) {
                  QTextCharFormat::setVerticalAlignment
                            ((QTextCharFormat *)
                             CONCAT26(in_stack_fffffffffffff5be.ucs,
                                      CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8))
                             ,in_stack_fffffffffffff5b4);
                }
              }
            }
            else {
              local_7e4.super_QFlagsStorage<Qt::AlignmentFlag>.i =
                   (QFlagsStorage<Qt::AlignmentFlag>)
                   QTextBlockFormat::alignment
                             ((QTextBlockFormat *)
                              CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
              local_7e0.super_QFlagsStorage<Qt::AlignmentFlag>.i =
                   (QFlagsStorage<Qt::AlignmentFlag>)
                   QFlags<Qt::AlignmentFlag>::operator&
                             ((QFlags<Qt::AlignmentFlag> *)
                              CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
                              in_stack_fffffffffffff5ac);
              IVar5 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_7e0);
              if (IVar5 == 0) {
                QTextBlockFormat::alignment
                          ((QTextBlockFormat *)
                           CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
                local_7e8.super_QFlagsStorage<Qt::AlignmentFlag>.i =
                     (QFlagsStorage<Qt::AlignmentFlag>)
                     QFlags<Qt::AlignmentFlag>::operator&
                               ((QFlags<Qt::AlignmentFlag> *)
                                CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
                                in_stack_fffffffffffff5ac);
                IVar5 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_7e8);
                if (IVar5 != 0) {
                  *(ushort *)&pQVar1->field_0x90 = *(ushort *)&pQVar1->field_0x90 & 0xfffc | 2;
                }
              }
              else {
                *(ushort *)&pQVar1->field_0x90 = *(ushort *)&pQVar1->field_0x90 & 0xfffc | 1;
              }
            }
          }
        }
        else {
          Qt::Literals::StringLiterals::operator____L1
                    ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                      CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8))
                     ,CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
          bVar4 = ::operator==((QString *)
                               CONCAT26(in_stack_fffffffffffff5be.ucs,
                                        CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8
                                                )),
                               (QLatin1StringView *)
                               CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
          if (bVar4) {
            QString::toLower((QString *)
                             CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8));
            QString::operator=((QString *)
                               CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
                               (QString *)
                               CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8));
            QString::~QString((QString *)0x8607a1);
            Qt::Literals::StringLiterals::operator____L1
                      ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                        CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8
                                                )),
                       CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
            bVar4 = ::operator==((QString *)
                                 CONCAT26(in_stack_fffffffffffff5be.ucs,
                                          CONCAT24(in_stack_fffffffffffff5bc,
                                                   in_stack_fffffffffffff5b8)),
                                 (QLatin1StringView *)
                                 CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
            if (bVar4) {
              QTextCharFormat::setVerticalAlignment
                        ((QTextCharFormat *)
                         CONCAT26(in_stack_fffffffffffff5be.ucs,
                                  CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8)),
                         in_stack_fffffffffffff5b4);
            }
            else {
              Qt::Literals::StringLiterals::operator____L1
                        ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                          CONCAT24(in_stack_fffffffffffff5bc,
                                                   in_stack_fffffffffffff5b8)),
                         CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
              bVar4 = ::operator==((QString *)
                                   CONCAT26(in_stack_fffffffffffff5be.ucs,
                                            CONCAT24(in_stack_fffffffffffff5bc,
                                                     in_stack_fffffffffffff5b8)),
                                   (QLatin1StringView *)
                                   CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
              if (bVar4) {
                QTextCharFormat::setVerticalAlignment
                          ((QTextCharFormat *)
                           CONCAT26(in_stack_fffffffffffff5be.ucs,
                                    CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8)),
                           in_stack_fffffffffffff5b4);
              }
              else {
                Qt::Literals::StringLiterals::operator____L1
                          ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                            CONCAT24(in_stack_fffffffffffff5bc,
                                                     in_stack_fffffffffffff5b8)),
                           CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
                bVar4 = ::operator==((QString *)
                                     CONCAT26(in_stack_fffffffffffff5be.ucs,
                                              CONCAT24(in_stack_fffffffffffff5bc,
                                                       in_stack_fffffffffffff5b8)),
                                     (QLatin1StringView *)
                                     CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
                if (bVar4) {
                  QTextCharFormat::setVerticalAlignment
                            ((QTextCharFormat *)
                             CONCAT26(in_stack_fffffffffffff5be.ucs,
                                      CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8))
                             ,in_stack_fffffffffffff5b4);
                }
              }
            }
          }
          else {
            Qt::Literals::StringLiterals::operator____L1
                      ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                        CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8
                                                )),
                       CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
            bVar4 = ::operator==((QString *)
                                 CONCAT26(in_stack_fffffffffffff5be.ucs,
                                          CONCAT24(in_stack_fffffffffffff5bc,
                                                   in_stack_fffffffffffff5b8)),
                                 (QLatin1StringView *)
                                 CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
            if (bVar4) {
              QString::toLower((QString *)
                               CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8));
              QString::operator=((QString *)
                                 CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
                                 (QString *)
                                 CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8));
              QString::~QString((QString *)0x86091d);
              Qt::Literals::StringLiterals::operator____L1
                        ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                          CONCAT24(in_stack_fffffffffffff5bc,
                                                   in_stack_fffffffffffff5b8)),
                         CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
              bVar4 = ::operator==((QString *)
                                   CONCAT26(in_stack_fffffffffffff5be.ucs,
                                            CONCAT24(in_stack_fffffffffffff5bc,
                                                     in_stack_fffffffffffff5b8)),
                                   (QLatin1StringView *)
                                   CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
              if (bVar4) {
                QTextFormat::setLayoutDirection
                          ((QTextFormat *)
                           CONCAT26(in_stack_fffffffffffff5be.ucs,
                                    CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8)),
                           in_stack_fffffffffffff5b4);
              }
              else {
                Qt::Literals::StringLiterals::operator____L1
                          ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                            CONCAT24(in_stack_fffffffffffff5bc,
                                                     in_stack_fffffffffffff5b8)),
                           CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
                bVar4 = ::operator==((QString *)
                                     CONCAT26(in_stack_fffffffffffff5be.ucs,
                                              CONCAT24(in_stack_fffffffffffff5bc,
                                                       in_stack_fffffffffffff5b8)),
                                     (QLatin1StringView *)
                                     CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
                if (bVar4) {
                  QTextFormat::setLayoutDirection
                            ((QTextFormat *)
                             CONCAT26(in_stack_fffffffffffff5be.ucs,
                                      CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8))
                             ,in_stack_fffffffffffff5b4);
                }
              }
            }
            else {
              Qt::Literals::StringLiterals::operator____L1
                        ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                          CONCAT24(in_stack_fffffffffffff5bc,
                                                   in_stack_fffffffffffff5b8)),
                         CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
              bVar4 = ::operator==((QString *)
                                   CONCAT26(in_stack_fffffffffffff5be.ucs,
                                            CONCAT24(in_stack_fffffffffffff5bc,
                                                     in_stack_fffffffffffff5b8)),
                                   (QLatin1StringView *)
                                   CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
              if (bVar4) {
                QTextCharFormat::setToolTip
                          ((QTextCharFormat *)
                           CONCAT26(in_stack_fffffffffffff5be.ucs,
                                    CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8)),
                           (QString *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0))
                ;
              }
              else {
                Qt::Literals::StringLiterals::operator____L1
                          ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                            CONCAT24(in_stack_fffffffffffff5bc,
                                                     in_stack_fffffffffffff5b8)),
                           CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
                bVar4 = ::operator==((QString *)
                                     CONCAT26(in_stack_fffffffffffff5be.ucs,
                                              CONCAT24(in_stack_fffffffffffff5bc,
                                                       in_stack_fffffffffffff5b8)),
                                     (QLatin1StringView *)
                                     CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
                if (bVar4) {
                  QTextCharFormat::setAnchor
                            ((QTextCharFormat *)
                             CONCAT26(in_stack_fffffffffffff5be.ucs,
                                      CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8))
                             ,SUB41(in_stack_fffffffffffff5b4 >> 0x18,0));
                  in_stack_fffffffffffff5c0 = (QTextHtmlParserNode *)&pQVar1->charFormat;
                  QString::QString((QString *)
                                   CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
                                   (QString *)
                                   CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8));
                  args_00._M_len = (size_type)in_stack_fffffffffffff5c8;
                  args_00._M_array = &in_stack_fffffffffffff5c0->tag;
                  QList<QString>::QList
                            ((QList<QString> *)
                             CONCAT26(in_stack_fffffffffffff5be.ucs,
                                      CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8))
                             ,args_00);
                  QTextCharFormat::setAnchorNames
                            ((QTextCharFormat *)
                             CONCAT26(in_stack_fffffffffffff5be.ucs,
                                      CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8))
                             ,(QStringList *)
                              CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
                  QList<QString>::~QList((QList<QString> *)0x860afa);
                  in_stack_fffffffffffff5c8 = &local_78;
                  in_stack_fffffffffffff5d0 = (QString *)local_60;
                  do {
                    pqVar2 = (qsizetype *)(in_stack_fffffffffffff5d0 + 0xffffffffffffffff);
                    in_stack_fffffffffffff5b8 = SUB84(pqVar2,0);
                    in_stack_fffffffffffff5bc = (undefined2)((ulong)pqVar2 >> 0x20);
                    in_stack_fffffffffffff5be.ucs = (char16_t)((ulong)pqVar2 >> 0x30);
                    QString::~QString((QString *)0x860b23);
                    in_stack_fffffffffffff5d0 =
                         (QString *)
                         CONCAT26(in_stack_fffffffffffff5be.ucs,
                                  CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8));
                  } while (in_stack_fffffffffffff5d0 != in_stack_fffffffffffff5c8);
                }
              }
            }
          }
        }
      }
      QString::~QString((QString *)0x860b50);
      QString::~QString((QString *)0x860b5d);
    }
    in_stack_fffffffffffff5b4 = in_stack_fffffffffffff5b4 & 0xffffff;
    LVar12 = in_stack_fffffffffffff5b4;
    if (*(long *)(in_RDI + 0x70) != 0) {
      bVar4 = QString::isEmpty((QString *)0x860b95);
      LVar12 = in_stack_fffffffffffff5b4 & 0xffffff;
      if (!bVar4) {
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)CONCAT26(in_stack_fffffffffffff5be.ucs,
                                    CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8)),
                   CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0) & 0xffffffffffffff)
        ;
        bVar4 = ::operator==((QString *)
                             CONCAT26(in_stack_fffffffffffff5be.ucs,
                                      CONCAT24(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8))
                             ,(QLatin1StringView *)CONCAT44(LVar12,in_stack_fffffffffffff5b0));
        LVar12 = (uint)bVar4 << 0x18;
      }
    }
    if ((char)(LVar12 >> 0x18) != '\0') {
      importStyleSheet(in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0);
    }
  }
  QString::~QString((QString *)0x860c13);
  QString::~QString((QString *)0x860c20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextHtmlParser::applyAttributes(const QStringList &attributes)
{
    // local state variable for qt3 textedit mode
    bool seenQt3Richtext = false;
    QString linkHref;
    QString linkType;

    if (attributes.size() % 2 == 1)
        return;

    QTextHtmlParserNode *node = nodes.last();

    for (int i = 0; i < attributes.size(); i += 2) {
        QString key = attributes.at(i);
        QString value = attributes.at(i + 1);

        switch (node->id) {
            case Html_font:
                // the infamous font tag
                if (key == "size"_L1 && value.size()) {
                    int n = value.toInt();
                    if (value.at(0) != u'+' && value.at(0) != u'-')
                        n -= 3;
                    node->charFormat.setProperty(QTextFormat::FontSizeAdjustment, n);
                } else if (key == "face"_L1) {
                    if (value.contains(u',')) {
                        QStringList families;
                        for (auto family : value.tokenize(u','))
                            families << family.trimmed().toString();
                        node->charFormat.setFontFamilies(families);
                    } else {
                        node->charFormat.setFontFamilies(QStringList(value));
                    }
                } else if (key == "color"_L1) {
                    QColor c = QColor::fromString(value);
                    if (!c.isValid())
                        qWarning("QTextHtmlParser::applyAttributes: Unknown color name '%s'",value.toLatin1().constData());
                    node->charFormat.setForeground(c);
                }
                break;
            case Html_ol:
            case Html_ul:
                if (key == "type"_L1) {
                    node->hasOwnListStyle = true;
                    if (value == "1"_L1) {
                        node->listStyle = QTextListFormat::ListDecimal;
                    } else if (value == "a"_L1) {
                        node->listStyle = QTextListFormat::ListLowerAlpha;
                    } else if (value == "A"_L1) {
                        node->listStyle = QTextListFormat::ListUpperAlpha;
                    } else if (value == "i"_L1) {
                        node->listStyle = QTextListFormat::ListLowerRoman;
                    } else if (value == "I"_L1) {
                        node->listStyle = QTextListFormat::ListUpperRoman;
                    } else {
                        value = std::move(value).toLower();
                        if (value == "square"_L1)
                            node->listStyle = QTextListFormat::ListSquare;
                        else if (value == "disc"_L1)
                            node->listStyle = QTextListFormat::ListDisc;
                        else if (value == "circle"_L1)
                            node->listStyle = QTextListFormat::ListCircle;
                        else if (value == "none"_L1)
                            node->listStyle = QTextListFormat::ListStyleUndefined;
                    }
                } else if (key == "start"_L1) {
                    setIntAttribute(&node->listStart, value);
                }
                break;
            case Html_li:
                if (key == "class"_L1) {
                    if (value == "unchecked"_L1)
                        node->blockFormat.setMarker(QTextBlockFormat::MarkerType::Unchecked);
                    else if (value == "checked"_L1)
                        node->blockFormat.setMarker(QTextBlockFormat::MarkerType::Checked);
                }
                break;
            case Html_a:
                if (key == "href"_L1)
                    node->charFormat.setAnchorHref(value);
                else if (key == "name"_L1)
                    node->charFormat.setAnchorNames({value});
                break;
            case Html_img:
                if (key == "src"_L1 || key == "source"_L1) {
                    node->imageName = value;
                } else if (key == "width"_L1) {
                    node->imageWidth = -2; // register that there is a value for it.
                    setFloatAttribute(&node->imageWidth, value);
                } else if (key == "height"_L1) {
                    node->imageHeight = -2; // register that there is a value for it.
                    setFloatAttribute(&node->imageHeight, value);
                } else if (key == "alt"_L1) {
                    node->imageAlt = value;
                } else if (key == "title"_L1) {
                    node->text = value;
                }
                break;
            case Html_tr:
            case Html_body:
                if (key == "bgcolor"_L1) {
                    QColor c = QColor::fromString(value);
                    if (!c.isValid())
                        qWarning("QTextHtmlParser::applyAttributes: Unknown color name '%s'",value.toLatin1().constData());
                    node->charFormat.setBackground(c);
                } else if (key == "background"_L1) {
                    node->applyBackgroundImage(value, resourceProvider);
                }
                break;
            case Html_th:
            case Html_td:
                if (key == "width"_L1) {
                    setWidthAttribute(&node->width, value);
                } else if (key == "bgcolor"_L1) {
                    QColor c = QColor::fromString(value);
                    if (!c.isValid())
                        qWarning("QTextHtmlParser::applyAttributes: Unknown color name '%s'",value.toLatin1().constData());
                    node->charFormat.setBackground(c);
                } else if (key == "background"_L1) {
                    node->applyBackgroundImage(value, resourceProvider);
                } else if (key == "rowspan"_L1) {
                    if (setIntAttribute(&node->tableCellRowSpan, value))
                        node->tableCellRowSpan = qMax(1, node->tableCellRowSpan);
                } else if (key == "colspan"_L1) {
                    if (setIntAttribute(&node->tableCellColSpan, value))
                        node->tableCellColSpan = qBound(1, node->tableCellColSpan, 20480);
                }
                break;
            case Html_table:
                // If table border already set through css style, prefer that one otherwise consider this value
                if (key == "border"_L1 && !node->tableBorder) {
                    setFloatAttribute(&node->tableBorder, value);
                } else if (key == "bgcolor"_L1) {
                    QColor c = QColor::fromString(value);
                    if (!c.isValid())
                        qWarning("QTextHtmlParser::applyAttributes: Unknown color name '%s'",value.toLatin1().constData());
                    node->charFormat.setBackground(c);
                } else if (key == "bordercolor"_L1) {
                    QColor c = QColor::fromString(value);
                    if (!c.isValid())
                        qWarning("QTextHtmlParser::applyAttributes: Unknown color name '%s'",value.toLatin1().constData());
                    node->borderBrush = c;
                } else if (key == "background"_L1) {
                    node->applyBackgroundImage(value, resourceProvider);
                } else if (key == "cellspacing"_L1) {
                    setFloatAttribute(&node->tableCellSpacing, value);
                } else if (key == "cellpadding"_L1) {
                    setFloatAttribute(&node->tableCellPadding, value);
                } else if (key == "width"_L1) {
                    setWidthAttribute(&node->width, value);
                } else if (key == "height"_L1) {
                    setWidthAttribute(&node->height, value);
                }
                break;
            case Html_meta:
                if (key == "name"_L1 && value == "qrichtext"_L1)
                    seenQt3Richtext = true;

                if (key == "content"_L1 && value == "1"_L1 && seenQt3Richtext)
                    textEditMode = true;
                break;
            case Html_hr:
                if (key == "width"_L1)
                    setWidthAttribute(&node->width, value);
                break;
            case Html_link:
                if (key == "href"_L1)
                    linkHref = value;
                else if (key == "type"_L1)
                    linkType = value;
                break;
            case Html_pre:
                if (key == "class"_L1 && value.startsWith("language-"_L1))
                    node->blockFormat.setProperty(QTextFormat::BlockCodeLanguage, value.mid(9));
                break;
            default:
                break;
        }

        if (key == "style"_L1) {
#ifndef QT_NO_CSSPARSER
            node->parseStyleAttribute(value, resourceProvider);
#endif
        } else if (key == "align"_L1) {
            value = std::move(value).toLower();
            bool alignmentSet = true;

            if (value == "left"_L1)
                node->blockFormat.setAlignment(Qt::AlignLeft|Qt::AlignAbsolute);
            else if (value == "right"_L1)
                node->blockFormat.setAlignment(Qt::AlignRight|Qt::AlignAbsolute);
            else if (value == "center"_L1)
                node->blockFormat.setAlignment(Qt::AlignHCenter);
            else if (value == "justify"_L1)
                node->blockFormat.setAlignment(Qt::AlignJustify);
            else
                alignmentSet = false;

            if (node->id == Html_img) {
                // HTML4 compat
                if (alignmentSet) {
                    if (node->blockFormat.alignment() & Qt::AlignLeft)
                        node->cssFloat = QTextFrameFormat::FloatLeft;
                    else if (node->blockFormat.alignment() & Qt::AlignRight)
                        node->cssFloat = QTextFrameFormat::FloatRight;
                } else if (value == "middle"_L1) {
                    node->charFormat.setVerticalAlignment(QTextCharFormat::AlignMiddle);
                } else if (value == "top"_L1) {
                    node->charFormat.setVerticalAlignment(QTextCharFormat::AlignTop);
                }
            }
        } else if (key == "valign"_L1) {
            value = std::move(value).toLower();
            if (value == "top"_L1)
                node->charFormat.setVerticalAlignment(QTextCharFormat::AlignTop);
            else if (value == "middle"_L1)
                node->charFormat.setVerticalAlignment(QTextCharFormat::AlignMiddle);
            else if (value == "bottom"_L1)
                node->charFormat.setVerticalAlignment(QTextCharFormat::AlignBottom);
        } else if (key == "dir"_L1) {
            value = std::move(value).toLower();
            if (value == "ltr"_L1)
                node->blockFormat.setLayoutDirection(Qt::LeftToRight);
            else if (value == "rtl"_L1)
                node->blockFormat.setLayoutDirection(Qt::RightToLeft);
        } else if (key == "title"_L1) {
            node->charFormat.setToolTip(value);
        } else if (key == "id"_L1) {
            node->charFormat.setAnchor(true);
            node->charFormat.setAnchorNames({value});
        }
    }

#ifndef QT_NO_CSSPARSER
    if (resourceProvider && !linkHref.isEmpty() && linkType == "text/css"_L1)
        importStyleSheet(linkHref);
#endif
}